

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<ki::protocol::net::Session,_PySession> * __thiscall
pybind11::class_<ki::protocol::net::Session,PySession>::
def_property<unsigned_char(ki::protocol::net::Session::*)()const,pybind11::return_value_policy>
          (class_<ki::protocol::net::Session,PySession> *this,char *name,
          offset_in_Message_to_subr *fget,cpp_function *fset,return_value_policy *extra)

{
  class_<ki::protocol::net::Session,_PySession> *pcVar1;
  return_value_policy local_59;
  offset_in_Message_to_subr local_58;
  void *local_48;
  offset_in_Message_to_subr local_40;
  cpp_function local_38;
  return_value_policy *local_30;
  return_value_policy *extra_local;
  cpp_function *fset_local;
  offset_in_Message_to_subr *fget_local;
  char *name_local;
  class_<ki::protocol::net::Session,_PySession> *this_local;
  
  local_48 = (void *)*fget;
  local_40 = fget[1];
  local_30 = extra;
  extra_local = (return_value_policy *)fset;
  fset_local = (cpp_function *)fget;
  fget_local = (offset_in_Message_to_subr *)name;
  name_local = (char *)this;
  local_58 = _ki__protocol__net__Session___pybind11__method_adaptor<ki::protocol::net::Session,unsigned_char,ki::protocol::net::Session>_unsigned_char_ki__protocol__net__Session______const__
                       (local_48,local_40);
  cpp_function::cpp_function<unsigned_char,ki::protocol::net::Session>(&local_38,local_58);
  local_59 = reference_internal;
  pcVar1 = def_property<pybind11::return_value_policy,pybind11::return_value_policy>
                     (this,name,&local_38,(cpp_function *)extra_local,&local_59,local_30);
  cpp_function::~cpp_function(&local_38);
  return pcVar1;
}

Assistant:

class_ &def_property(const char *name, const Getter &fget, const cpp_function &fset, const Extra& ...extra) {
        return def_property(name, cpp_function(method_adaptor<type>(fget)), fset,
                            return_value_policy::reference_internal, extra...);
    }